

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginListBox(char *label,ImVec2 *size_arg)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiID id;
  ImGuiContext *g;
  uint uVar4;
  float fVar5;
  ImVec2 IVar6;
  float fVar7;
  ImVec2 IVar8;
  ImRect frame_bb;
  ImRect bb;
  ImRect local_a8;
  ImVec2 local_98;
  undefined1 local_88 [16];
  ImVec2 local_78;
  undefined8 uStack_70;
  ImVec2 local_60;
  ImRect local_58;
  undefined1 local_48 [16];
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    id = GetID(label);
    local_98 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_78 = *size_arg;
    uStack_70 = 0;
    local_88._0_4_ = CalcItemWidth();
    fVar5 = GetTextLineHeightWithSpacing();
    fVar7 = (pIVar2->Style).FramePadding.y;
    IVar6 = CalcItemSize(local_78,(float)local_88._0_4_,fVar7 + fVar7 + fVar5 * 7.25);
    uVar4 = -(uint)(local_98.y <= (float)(int)IVar6.y);
    local_78.y = local_98.y;
    local_78.x = local_98.y;
    uStack_70 = CONCAT44(local_98.y,local_98.y);
    fVar7 = (float)(int)IVar6.x + (pIVar1->DC).CursorPos.x;
    local_58.Max.y =
         (float)(uVar4 & (uint)(float)(int)IVar6.y | ~uVar4 & (uint)local_98.y) +
         (pIVar1->DC).CursorPos.y;
    local_a8.Min = (pIVar1->DC).CursorPos;
    local_a8.Max.y = local_58.Max.y;
    local_a8.Max.x = fVar7;
    local_58.Max.x = 0.0;
    if (0.0 < local_98.x) {
      local_58.Max.x = (pIVar2->Style).ItemInnerSpacing.x + local_98.x;
    }
    local_58.Max.x = local_58.Max.x + fVar7;
    local_58.Max.y = local_58.Max.y + 0.0;
    (pIVar2->NextItemData).Flags = 0;
    local_58.Min = local_a8.Min;
    bVar3 = IsRectVisible(&local_58.Min,&local_58.Max);
    if (bVar3) {
      BeginGroup();
      if (0.0 < local_98.x) {
        fVar5 = local_a8.Max.x + (pIVar2->Style).ItemInnerSpacing.x;
        local_48 = ZEXT416((uint)fVar5);
        fVar7 = local_a8.Min.y + (pIVar2->Style).FramePadding.y;
        local_88 = ZEXT416((uint)fVar7);
        IVar6.y = fVar7;
        IVar6.x = fVar5;
        RenderText(IVar6,label,(char *)0x0,true);
        fVar7 = (pIVar1->DC).CursorMaxPos.x;
        fVar5 = (pIVar1->DC).CursorMaxPos.y;
        uVar4 = -(uint)((float)local_48._0_4_ + local_98.x <= fVar7);
        IVar8.x = (float)(uVar4 & (uint)fVar7 | ~uVar4 & (uint)((float)local_48._0_4_ + local_98.x))
        ;
        uVar4 = -(uint)((float)local_88._0_4_ + local_78.x <= fVar5);
        IVar8.y = (float)(uVar4 & (uint)fVar5 | ~uVar4 & (uint)((float)local_88._0_4_ + local_78.x))
        ;
        (pIVar1->DC).CursorMaxPos = IVar8;
      }
      local_60.x = local_a8.Max.x - local_a8.Min.x;
      local_60.y = local_a8.Max.y - local_a8.Min.y;
      BeginChildFrame(id,&local_60,0);
    }
    else {
      local_60.x = local_58.Max.x - local_58.Min.x;
      local_60.y = local_58.Max.y - local_58.Min.y;
      ItemSize(&local_60,(pIVar2->Style).FramePadding.y);
      ItemAdd(&local_58,0,&local_a8,0);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::BeginListBox(const char* label, const ImVec2& size_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    // Size default to hold ~7.25 items.
    // Fractional number of items helps seeing that we can scroll down/up without looking at scrollbar.
    ImVec2 size = ImFloor(CalcItemSize(size_arg, CalcItemWidth(), GetTextLineHeightWithSpacing() * 7.25f + style.FramePadding.y * 2.0f));
    ImVec2 frame_size = ImVec2(size.x, ImMax(size.y, label_size.y));
    ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    ImRect bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    g.NextItemData.ClearFlags();

    if (!IsRectVisible(bb.Min, bb.Max))
    {
        ItemSize(bb.GetSize(), style.FramePadding.y);
        ItemAdd(bb, 0, &frame_bb);
        return false;
    }

    // FIXME-OPT: We could omit the BeginGroup() if label_size.x but would need to omit the EndGroup() as well.
    BeginGroup();
    if (label_size.x > 0.0f)
    {
        ImVec2 label_pos = ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y);
        RenderText(label_pos, label);
        window->DC.CursorMaxPos = ImMax(window->DC.CursorMaxPos, label_pos + label_size);
    }

    BeginChildFrame(id, frame_bb.GetSize());
    return true;
}